

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

err_t Node_Toggle(void *Node,dataid Id)

{
  err_t eVar1;
  bool_t Bool;
  
  Bool = 0;
  if (Node != (void *)0x0) {
    (**(code **)(*(long *)((long)Node + 8) + 0x18))(Node,Id,&Bool,8);
    Bool = (bool_t)(Bool == 0);
    eVar1 = (**(code **)(*(long *)((long)Node + 8) + 0x20))(Node,Id,&Bool,8);
    return eVar1;
  }
  __assert_fail("(const void*)(Node)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0xa9f,"err_t Node_Toggle(void *, dataid)");
}

Assistant:

err_t Node_Toggle(void* Node,dataid Id)
{
    bool_t Bool = 0;
    Node_GET(Node,Id,&Bool);
    Bool = !Bool;
    return Node_SET(Node,Id,&Bool);
}